

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

double __thiscall
baryonyx::itm::default_cost_type<double>::results
          (default_cost_type<double> *this,bit_array *x,double cost_constant)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  int local_24;
  int e;
  int i;
  double cost_constant_local;
  bit_array *x_local;
  default_cost_type<double> *this_local;
  
  local_24 = 0;
  iVar1 = length<std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
                    (&this->obj->elements);
  _e = cost_constant;
  for (; local_24 != iVar1; local_24 = local_24 + 1) {
    pvVar3 = std::
             vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
             ::operator[](&this->obj->elements,(long)local_24);
    iVar2 = bit_array::operator[](x,pvVar3->variable_index);
    if (iVar2 != 0) {
      pvVar3 = std::
               vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
               ::operator[](&this->obj->elements,(long)local_24);
      _e = pvVar3->factor + _e;
    }
  }
  return _e;
}

Assistant:

double results(const bit_array& x, double cost_constant) const noexcept
    {
        for (int i = 0, e = length(obj.elements); i != e; ++i)
            if (x[obj.elements[i].variable_index])
                cost_constant += obj.elements[i].factor;

        return cost_constant;
    }